

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sys_rand.c
# Opt level: O2

int randombytes_linux_getrandom(void *buf_,size_t size)

{
  long lVar1;
  int *piVar2;
  ulong uVar3;
  
  uVar3 = 0x100;
  do {
    if (size < uVar3) {
      uVar3 = size;
    }
    do {
      lVar1 = syscall(0x13e,buf_,uVar3 & 0xffffffff,0);
      if (-1 < (int)lVar1) break;
      piVar2 = __errno_location();
    } while ((*piVar2 == 4) || (*piVar2 == 0xb));
    if ((int)lVar1 != (int)uVar3) {
      return -1;
    }
    buf_ = (void *)((long)buf_ + uVar3);
    size = size - uVar3;
    if (size == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

static int randombytes_linux_getrandom(void * const buf_, size_t size)
{
    unsigned char *buf = (unsigned char *) buf_;
    size_t         chunk_size = 256U;

    do {
        if (size < chunk_size) 
        {
            chunk_size = size;
            assert(chunk_size > (size_t) 0U);
        }
        if (_randombytes_linux_getrandom(buf, chunk_size) != 0) 
        {
            return -1;
        }
        size -= chunk_size;
        buf += chunk_size;
    } while (size > (size_t) 0U);

    return 0;
}